

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  ImBitVector *this;
  uint *puVar1;
  stbtt_uint8 sVar2;
  byte bVar3;
  ImWchar IVar4;
  uint uVar5;
  ImFont *pIVar6;
  ImFont **ppIVar7;
  stbtt_uint8 *data;
  undefined8 *puVar8;
  ImFontConfig *pIVar9;
  stbrp_node *psVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  stbtt__buf fontdict;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  stbtt__point *psVar15;
  size_t sVar16;
  bool bVar17;
  ushort uVar18;
  short sVar19;
  stbtt_uint32 sVar20;
  stbtt_uint32 sVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  stbtt__active_edge *z;
  stbtt_uint32 sVar21;
  stbtt_uint32 sVar22;
  stbtt_uint32 sVar23;
  stbtt_uint32 sVar24;
  stbtt_uint32 sVar25;
  ulong uVar31;
  undefined4 extraout_var;
  int *piVar32;
  void *pvVar33;
  void *pvVar34;
  stbrp_context *ptr;
  uchar *puVar35;
  stbtt__point *points;
  stbtt__edge *p_00;
  stbtt__buf *scanline;
  stbtt__active_edge *psVar36;
  stbtt__buf *psVar37;
  stbtt__active_edge *psVar38;
  undefined8 *puVar39;
  int iVar40;
  long lVar41;
  ulong uVar42;
  ImWchar *pIVar43;
  uint *puVar44;
  stbtt__active_edge *psVar45;
  stbtt__active_edge *psVar46;
  char *__function;
  short sVar47;
  int iVar48;
  long lVar49;
  ulong uVar50;
  long lVar51;
  long lVar52;
  byte *pbVar53;
  size_t sVar54;
  uint uVar55;
  ushort *puVar56;
  uchar uVar57;
  ulong uVar58;
  long lVar59;
  size_t size;
  byte *pbVar60;
  ImFontConfig *pIVar61;
  ulong uVar62;
  int iVar63;
  long lVar64;
  ImU32 bit_n;
  uint uVar65;
  stbtt__edge *psVar66;
  void *p;
  stbtt_fontinfo *psVar67;
  bool bVar68;
  float fVar69;
  float fVar70;
  undefined4 uVar71;
  float fVar72;
  float fVar73;
  float in_XMM3_Da;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  stbtt__buf sVar82;
  float y0_2;
  int y1;
  stbtt_uint32 charstrings;
  ImVector<stbrp_rect> buf_rects;
  ImVector<stbtt_packedchar> buf_packedchars;
  stbtt_uint32 fdarrayoff;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  stbtt__buf b;
  undefined8 in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb3c;
  int iVar83;
  byte bVar84;
  void *local_4c0;
  undefined4 in_stack_fffffffffffffb60;
  int in_stack_fffffffffffffb64;
  stbtt_uint32 local_47c;
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [24];
  void *local_440;
  undefined1 local_438 [16];
  int local_41c;
  void *local_418;
  stbtt__active_edge *local_410;
  undefined8 local_408;
  void *pvStack_400;
  stbrp_node *local_3f0;
  ulong local_3e8;
  ulong local_3e0;
  undefined8 local_3d8;
  float local_3d0;
  float local_3cc;
  undefined1 local_3c8 [16];
  undefined8 *local_3b8;
  ulong local_3b0;
  float local_3a8;
  float local_3a4;
  int local_3a0;
  float local_39c;
  long local_398;
  ulong local_390;
  uchar *local_388;
  long local_380;
  uchar *local_378;
  ulong local_370;
  ulong local_368;
  float *local_360;
  float local_354;
  float local_350;
  uint local_34c;
  uint local_348;
  uint local_344;
  int local_340;
  int local_33c;
  float local_338;
  int local_334;
  int local_330;
  int local_32c;
  undefined1 local_328 [16];
  stbrp_context *local_310;
  stbtt_fontinfo *local_308;
  stbtt__point *local_300;
  ulong local_2f8;
  float *local_2f0;
  float local_2e8;
  undefined4 uStack_2e4;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  undefined1 local_2d8 [16];
  size_t local_2c0;
  ImFontConfig *local_2b8;
  long local_2b0;
  short *local_2a8;
  ulong local_2a0;
  ulong local_298;
  ulong local_290;
  long local_288;
  size_t local_280;
  size_t local_278;
  int local_270;
  int local_26c;
  undefined1 local_268 [16];
  stbtt__buf local_258 [33];
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_3c8._8_8_ = local_3c8._0_8_;
  local_2d8._8_8_ = local_2d8._0_8_;
  if ((atlas->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_draw.cpp"
                  ,0x932,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  local_4c0 = (void *)0x0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  uVar5 = (atlas->ConfigData).Size;
  lVar41 = (long)(int)uVar5;
  if (0 < lVar41) {
    uVar31 = 8;
    if (8 < (int)uVar5) {
      uVar31 = (ulong)uVar5;
    }
    local_4c0 = ImGui::MemAlloc(uVar31 * 0x110);
  }
  uVar27 = (atlas->Fonts).Size;
  lVar64 = (long)(int)uVar27;
  if (lVar64 < 1) {
    local_418 = (void *)0x0;
  }
  else {
    uVar31 = 8;
    if (8 < (int)uVar27) {
      uVar31 = (ulong)uVar27;
    }
    local_418 = ImGui::MemAlloc(uVar31 << 5);
  }
  local_2c0 = lVar41 * 0x110;
  memset(local_4c0,0,local_2c0);
  local_2d8._0_8_ = lVar64 << 5;
  memset(local_418,0,lVar64 << 5);
  uVar27 = (atlas->ConfigData).Size;
  uVar31 = (ulong)uVar27;
  iVar83 = CONCAT13((int)uVar27 < 1,(int3)in_stack_fffffffffffffb3c);
  local_3c8._0_8_ = lVar64;
  if (0 < (int)uVar27) {
    uVar42 = 0;
    if (0 < (int)uVar5) {
      uVar42 = (ulong)uVar5;
    }
    local_328._0_8_ = uVar42;
    lVar59 = 0;
    do {
      if (lVar59 == local_328._0_8_) {
        __function = "T &ImVector<ImFontBuildSrcData>::operator[](int) [T = ImFontBuildSrcData]";
        goto LAB_00189a77;
      }
      if ((int)uVar31 <= lVar59) goto LAB_00189b3b;
      pIVar61 = (atlas->ConfigData).Data;
      pIVar6 = pIVar61[lVar59].DstFont;
      if ((pIVar6 == (ImFont *)0x0) ||
         (pIVar6->ContainerAtlas != atlas && pIVar6->ContainerAtlas != (ImFontAtlas *)0x0)) {
        __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_draw.cpp"
                      ,0x94a,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(undefined4 *)((long)local_4c0 + lVar59 * 0x110 + 0xe0) = 0xffffffff;
      uVar31 = (ulong)(atlas->Fonts).Size;
      if ((long)uVar31 < 1) {
LAB_00189b8e:
        __assert_fail("src_tmp.DstIndex != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_draw.cpp"
                      ,0x953,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      pIVar61 = pIVar61 + lVar59;
      ppIVar7 = (atlas->Fonts).Data;
      uVar58 = 0xffffffff;
      uVar42 = 0;
      do {
        if (pIVar6 == ppIVar7[uVar42]) {
          *(int *)((long)local_4c0 + lVar59 * 0x110 + 0xe0) = (int)uVar42;
          uVar58 = uVar42 & 0xffffffff;
        }
        uVar42 = uVar42 + 1;
      } while ((uVar42 < uVar31) && ((int)uVar58 == -1));
      if ((int)uVar58 == -1) goto LAB_00189b8e;
      data = (stbtt_uint8 *)pIVar61->FontData;
      iVar28 = pIVar61->FontNo;
      sVar2 = *data;
      if (((((sVar2 == '1') && (data[1] == '\0')) && (data[2] == '\0')) && (data[3] == '\0')) ||
         (((sVar2 == 't' && (data[1] == 'y')) && ((data[2] == 'p' && (data[3] == '1')))))) {
LAB_001869a7:
        sVar26 = -(uint)(iVar28 != 0);
      }
      else {
        if (sVar2 == '\0') {
          if (((data[1] != '\x01') || (data[2] != '\0')) || (data[3] != '\0')) goto LAB_0018697f;
          goto LAB_001869a7;
        }
        if ((((sVar2 == 'O') && (data[1] == 'T')) && (data[2] == 'T')) && (data[3] == 'O'))
        goto LAB_001869a7;
LAB_0018697f:
        sVar26 = 0xffffffff;
        if (sVar2 == 't') {
          if (data[1] == 't') {
            if ((data[2] == 'c') && (data[3] == 'f')) {
              uVar27 = *(uint *)(data + 4);
              uVar27 = uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 |
                       uVar27 << 0x18;
              if (((uVar27 == 0x20000) || (uVar27 == 0x10000)) &&
                 (uVar27 = *(uint *)(data + 8),
                 iVar28 < (int)(uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 |
                               uVar27 << 0x18))) {
                uVar27 = *(uint *)(data + (long)iVar28 * 4 + 0xc);
                sVar26 = uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 |
                         uVar27 << 0x18;
              }
            }
          }
          else if (((data[1] == 'r') && (data[2] == 'u')) && (data[3] == 'e')) goto LAB_001869a7;
        }
      }
      local_438._0_8_ = pIVar61;
      if ((int)sVar26 < 0) {
        __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_draw.cpp"
                      ,0x958,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(stbtt_uint8 **)((long)local_4c0 + lVar59 * 0x110 + 8) = data;
      *(stbtt_uint32 *)((long)local_4c0 + lVar59 * 0x110 + 0x10) = sVar26;
      *(undefined8 *)((long)local_4c0 + lVar59 * 0x110 + 0x40) = 0;
      *(undefined8 *)((long)local_4c0 + lVar59 * 0x110 + 0x48) = 0;
      sVar20 = stbtt__find_table(data,sVar26,"cmap");
      uVar71 = extraout_var;
      sVar21 = stbtt__find_table(data,sVar26,"loca");
      *(stbtt_uint32 *)((long)local_4c0 + lVar59 * 0x110 + 0x18) = sVar21;
      sVar22 = stbtt__find_table(data,sVar26,"head");
      local_468._0_4_ = sVar22;
      *(stbtt_uint32 *)((long)local_4c0 + lVar59 * 0x110 + 0x1c) = sVar22;
      sVar22 = stbtt__find_table(data,sVar26,"glyf");
      *(stbtt_uint32 *)((long)local_4c0 + lVar59 * 0x110 + 0x20) = sVar22;
      sVar23 = stbtt__find_table(data,sVar26,"hhea");
      *(stbtt_uint32 *)((long)local_4c0 + lVar59 * 0x110 + 0x24) = sVar23;
      sVar24 = stbtt__find_table(data,sVar26,"hmtx");
      *(stbtt_uint32 *)((long)local_4c0 + lVar59 * 0x110 + 0x28) = sVar24;
      sVar25 = stbtt__find_table(data,sVar26,"kern");
      *(stbtt_uint32 *)((long)local_4c0 + lVar59 * 0x110 + 0x2c) = sVar25;
      sVar25 = stbtt__find_table(data,sVar26,"GPOS");
      *(stbtt_uint32 *)((long)local_4c0 + lVar59 * 0x110 + 0x30) = sVar25;
      if ((((sVar20 == 0) || ((float)local_468._0_4_ == 0.0)) || (sVar23 == 0)) || (sVar24 == 0))
      goto LAB_00189950;
      if (sVar22 == 0) {
        local_408 = CONCAT44(local_408._4_4_,2);
        local_478._0_8_ = local_478._0_8_ & 0xffffffff00000000;
        local_3d8._0_4_ = 0;
        local_47c = 0;
        sVar22 = stbtt__find_table(data,sVar26,"CFF ");
        if (sVar22 == 0) goto LAB_00189950;
        *(undefined8 *)((long)local_4c0 + lVar59 * 0x110 + 0x90) = 0;
        *(undefined8 *)((long)local_4c0 + lVar59 * 0x110 + 0x98) = 0;
        *(undefined8 *)((long)local_4c0 + lVar59 * 0x110 + 0x80) = 0;
        *(undefined8 *)((long)local_4c0 + lVar59 * 0x110 + 0x88) = 0;
        *(stbtt_uint8 **)((long)local_4c0 + lVar59 * 0x110 + 0x40) = data + sVar22;
        *(undefined8 *)((long)local_4c0 + lVar59 * 0x110 + 0x48) = 0x2000000000000000;
        local_258[0].data = *(uchar **)((long)local_4c0 + lVar59 * 0x110 + 0x40);
        local_258[0]._8_8_ = *(undefined8 *)((long)local_4c0 + lVar59 * 0x110 + 0x48);
        if ((long)local_258[0].cursor < -2) {
LAB_00189c00:
          __assert_fail("!(o > b->size || o < 0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imstb_truetype.h"
                        ,0x482,"void stbtt__buf_seek(stbtt__buf *, int)");
        }
        lVar64 = (long)local_258[0].cursor + 2;
        iVar28 = (int)lVar64;
        if (local_258[0].size < iVar28) goto LAB_00189c00;
        uVar27 = 0;
        if (iVar28 < local_258[0].size) {
          iVar28 = local_258[0].cursor + 3;
          uVar27 = (uint)local_258[0].data[lVar64];
        }
        local_258[0].cursor = iVar28;
        if (local_258[0].size < (int)uVar27) goto LAB_00189c00;
        local_258[0].cursor = uVar27;
        stbtt__cff_get_index(local_258);
        sVar82 = stbtt__cff_get_index(local_258);
        local_458._0_16_ = (undefined1  [16])stbtt__cff_index_get(sVar82,0);
        stbtt__cff_get_index(local_258);
        sVar82 = stbtt__cff_get_index(local_258);
        *(stbtt__buf *)((long)local_4c0 + lVar59 * 0x110 + 0x60) = sVar82;
        stbtt__dict_get_ints((stbtt__buf *)local_458,0x11,1,(stbtt_uint32 *)local_478);
        stbtt__dict_get_ints((stbtt__buf *)local_458,0x106,1,(stbtt_uint32 *)&local_408);
        stbtt__dict_get_ints((stbtt__buf *)local_458,0x124,1,(stbtt_uint32 *)&local_3d8);
        stbtt__dict_get_ints((stbtt__buf *)local_458,0x125,1,&local_47c);
        sVar82.cursor = sVar21;
        sVar82.data = (uchar *)in_stack_fffffffffffffb30;
        sVar82.size = iVar83;
        fontdict.data._4_4_ = uVar71;
        fontdict.data._0_4_ = sVar20;
        fontdict.cursor = in_stack_fffffffffffffb60;
        fontdict.size = in_stack_fffffffffffffb64;
        sVar82 = stbtt__get_subrs(sVar82,fontdict);
        sVar21 = local_47c;
        *(stbtt__buf *)((long)local_4c0 + lVar59 * 0x110 + 0x70) = sVar82;
        if (((stbtt_uint32)local_408 != 2) || (uVar71 = local_478._0_4_, local_478._0_4_ == 0))
        goto LAB_00189950;
        if ((stbtt_uint32)local_3d8 != 0) {
          uVar31 = (ulong)local_47c;
          if (uVar31 == 0) goto LAB_00189950;
          if (((int)(stbtt_uint32)local_3d8 < 0) ||
             (local_258[0].size < (int)(stbtt_uint32)local_3d8)) goto LAB_00189c00;
          local_258[0].cursor = (stbtt_uint32)local_3d8;
          sVar82 = stbtt__cff_get_index(local_258);
          *(stbtt__buf *)((long)local_4c0 + lVar59 * 0x110 + 0x80) = sVar82;
          puVar35 = local_258[0].data + uVar31;
          lVar64 = (ulong)(local_258[0].size - sVar21) << 0x20;
          if ((int)(local_258[0].size - sVar21 | sVar21) < 0 || local_258[0].size < (int)sVar21) {
            puVar35 = (uchar *)0x0;
            lVar64 = 0;
          }
          *(uchar **)((long)local_4c0 + lVar59 * 0x110 + 0x90) = puVar35;
          *(long *)((long)local_4c0 + lVar59 * 0x110 + 0x98) = lVar64;
        }
        if (((int)uVar71 < 0) || (local_258[0].size < (int)uVar71)) goto LAB_00189c00;
        local_258[0].cursor = uVar71;
        sVar82 = stbtt__cff_get_index(local_258);
        *(stbtt__buf *)((long)local_4c0 + lVar59 * 0x110 + 0x50) = sVar82;
      }
      else if (sVar21 == 0) goto LAB_00189950;
      sVar26 = stbtt__find_table(data,sVar26,"maxp");
      if (sVar26 == 0) {
        uVar27 = 0xffff;
      }
      else {
        uVar27 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar26 + 4) << 8 |
                               *(ushort *)(data + (ulong)sVar26 + 4) >> 8);
      }
      *(uint *)((long)local_4c0 + lVar59 * 0x110 + 0x14) = uVar27;
      *(undefined4 *)((long)local_4c0 + lVar59 * 0x110 + 0x34) = 0xffffffff;
      uVar18 = *(ushort *)(data + (ulong)sVar20 + 2) << 8 |
               *(ushort *)(data + (ulong)sVar20 + 2) >> 8;
      *(undefined4 *)((long)local_4c0 + lVar59 * 0x110 + 0x38) = 0;
      if (uVar18 != 0) {
        uVar27 = sVar20 + 4;
        uVar31 = (ulong)uVar18;
        do {
          uVar18 = *(ushort *)(data + uVar27) << 8 | *(ushort *)(data + uVar27) >> 8;
          if ((uVar18 == 0) ||
             ((uVar18 == 3 &&
              ((uVar18 = *(ushort *)(data + (ulong)uVar27 + 2) << 8 |
                         *(ushort *)(data + (ulong)uVar27 + 2) >> 8, uVar18 == 10 || (uVar18 == 1)))
              ))) {
            uVar55 = *(uint *)(data + (ulong)uVar27 + 4);
            *(uint *)((long)local_4c0 + lVar59 * 0x110 + 0x38) =
                 (uVar55 >> 0x18 | (uVar55 & 0xff0000) >> 8 | (uVar55 & 0xff00) << 8 |
                 uVar55 << 0x18) + sVar20;
          }
          uVar27 = uVar27 + 8;
          uVar31 = uVar31 - 1;
        } while (uVar31 != 0);
      }
      if (*(int *)((long)local_4c0 + lVar59 * 0x110 + 0x38) == 0) goto LAB_00189950;
      *(uint *)((long)local_4c0 + lVar59 * 0x110 + 0x3c) =
           (uint)(ushort)(*(ushort *)
                           (data + (long)*(int *)((long)local_4c0 + lVar59 * 0x110 + 0x1c) + 0x32)
                          << 8 | *(ushort *)
                                  (data + (long)*(int *)((long)local_4c0 + lVar59 * 0x110 + 0x1c) +
                                          0x32) >> 8);
      iVar28 = *(int *)((long)local_4c0 + lVar59 * 0x110 + 0xe0);
      if (((long)iVar28 < 0) || (local_3c8._0_4_ <= iVar28)) goto LAB_00189b55;
      pIVar43 = *(ImWchar **)(local_438._0_8_ + 0x38);
      if (pIVar43 == (ImWchar *)0x0) {
        pIVar43 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)local_4c0 + lVar59 * 0x110 + 0xd8) = pIVar43;
      IVar4 = *pIVar43;
      while (IVar4 != 0) {
        uVar18 = pIVar43[1];
        if (uVar18 == 0) break;
        uVar27 = *(uint *)((long)local_4c0 + lVar59 * 0x110 + 0xe4);
        uVar55 = (uint)uVar18;
        if ((int)(uint)uVar18 < (int)uVar27) {
          uVar55 = uVar27;
        }
        *(uint *)((long)local_4c0 + lVar59 * 0x110 + 0xe4) = uVar55;
        IVar4 = pIVar43[2];
        pIVar43 = pIVar43 + 2;
      }
      piVar32 = (int *)((long)iVar28 * 0x20 + (long)local_418);
      *piVar32 = *piVar32 + 1;
      iVar28 = *(int *)((long)local_4c0 + lVar59 * 0x110 + 0xe4);
      if (iVar28 < piVar32[1]) {
        iVar28 = piVar32[1];
      }
      piVar32[1] = iVar28;
      lVar59 = lVar59 + 1;
      uVar31 = (ulong)(atlas->ConfigData).Size;
      iVar83 = CONCAT13((long)uVar31 <= lVar59,(int3)iVar83);
      lVar64 = local_3c8._0_8_;
    } while (lVar59 < (long)uVar31);
  }
  uVar27 = 0;
  if (0 < (int)uVar5) {
    lVar59 = 0;
    uVar27 = 0;
    do {
      iVar28 = *(int *)((long)local_4c0 + lVar59 * 0x110 + 0xe0);
      lVar51 = (long)iVar28;
      if ((lVar51 < 0) || ((int)lVar64 <= iVar28)) goto LAB_00189b55;
      local_468._0_8_ = lVar59;
      psVar67 = (stbtt_fontinfo *)(lVar59 * 0x110 + (long)local_4c0);
      ImBitVector::Create((ImBitVector *)&psVar67[1].charstrings,
                          *(int *)((long)&psVar67[1].cff.data + 4) + 1);
      pvVar34 = local_418;
      this = (ImBitVector *)((long)local_418 + lVar51 * 0x20 + 0x10);
      if (*(int *)((long)local_418 + lVar51 * 0x20 + 0x10) == 0) {
        ImBitVector::Create(this,*(int *)((long)local_418 + lVar51 * 0x20 + 4) + 1);
      }
      puVar56 = *(ushort **)&psVar67[1].index_map;
      uVar18 = *puVar56;
      for (; (uVar18 != 0 && (puVar56[1] != 0)); puVar56 = puVar56 + 2) {
        if (uVar18 <= puVar56[1]) {
          uVar55 = (uint)uVar18;
          do {
            bVar17 = ImBitVector::TestBit(this,uVar55);
            if ((!bVar17) && (iVar28 = stbtt_FindGlyphIndex(psVar67,uVar55), iVar28 != 0)) {
              piVar32 = &psVar67[1].cff.cursor;
              *piVar32 = *piVar32 + 1;
              piVar32 = (int *)((long)pvVar34 + lVar51 * 0x20 + 8);
              *piVar32 = *piVar32 + 1;
              ImBitVector::SetBit((ImBitVector *)&psVar67[1].charstrings,uVar55);
              ImBitVector::SetBit(this,uVar55);
              uVar27 = uVar27 + 1;
            }
            bVar17 = uVar55 < puVar56[1];
            uVar55 = uVar55 + 1;
          } while (bVar17);
        }
        uVar18 = puVar56[2];
      }
      lVar59 = local_468._0_8_ + 1;
      lVar64 = local_3c8._0_8_;
    } while (lVar59 != lVar41);
  }
  if (0 < (int)uVar5) {
    lVar64 = 0;
    do {
      local_438._0_8_ = lVar64;
      lVar64 = lVar64 * 0x110;
      iVar28 = *(int *)((long)local_4c0 + lVar64 + 0xe8);
      if (*(int *)((long)local_4c0 + lVar64 + 0x104) < iVar28) {
        pvVar33 = ImGui::MemAlloc((long)iVar28 << 2);
        pvVar34 = *(void **)((long)local_4c0 + lVar64 + 0x108);
        if (pvVar34 != (void *)0x0) {
          memcpy(pvVar33,pvVar34,(long)*(int *)((long)local_4c0 + lVar64 + 0x100) << 2);
          ImGui::MemFree(*(void **)((long)local_4c0 + lVar64 + 0x108));
        }
        *(void **)((long)local_4c0 + lVar64 + 0x108) = pvVar33;
        *(int *)((long)local_4c0 + lVar64 + 0x104) = iVar28;
      }
      lVar59 = (long)*(int *)((long)local_4c0 + lVar64 + 0xf0);
      if (0 < lVar59) {
        puVar44 = *(uint **)((long)local_4c0 + lVar64 + 0xf8);
        puVar1 = puVar44 + lVar59;
        iVar28 = 0;
        do {
          local_468._0_8_ = puVar44;
          uVar55 = *puVar44;
          if (uVar55 != 0) {
            uVar65 = 0;
            do {
              if ((uVar55 >> (uVar65 & 0x1f) & 1) != 0) {
                iVar63 = *(int *)((long)local_4c0 + lVar64 + 0x100);
                iVar30 = *(int *)((long)local_4c0 + lVar64 + 0x104);
                if (iVar63 == iVar30) {
                  if (iVar30 == 0) {
                    iVar40 = 8;
                  }
                  else {
                    iVar40 = iVar30 / 2 + iVar30;
                  }
                  iVar63 = iVar63 + 1;
                  if (iVar63 < iVar40) {
                    iVar63 = iVar40;
                  }
                  if (iVar30 < iVar63) {
                    pvVar33 = ImGui::MemAlloc((long)iVar63 << 2);
                    pvVar34 = *(void **)((long)local_4c0 + lVar64 + 0x108);
                    if (pvVar34 != (void *)0x0) {
                      memcpy(pvVar33,pvVar34,(long)*(int *)((long)local_4c0 + lVar64 + 0x100) << 2);
                      ImGui::MemFree(*(void **)((long)local_4c0 + lVar64 + 0x108));
                    }
                    *(void **)((long)local_4c0 + lVar64 + 0x108) = pvVar33;
                    *(int *)((long)local_4c0 + lVar64 + 0x104) = iVar63;
                  }
                }
                *(uint *)(*(long *)((long)local_4c0 + lVar64 + 0x108) +
                         (long)*(int *)((long)local_4c0 + lVar64 + 0x100) * 4) = iVar28 + uVar65;
                piVar32 = (int *)((long)local_4c0 + lVar64 + 0x100);
                *piVar32 = *piVar32 + 1;
              }
              uVar65 = uVar65 + 1;
            } while (uVar65 != 0x20);
          }
          puVar44 = (uint *)(local_468._0_8_ + 4);
          iVar28 = iVar28 + 0x20;
        } while (puVar44 < puVar1);
      }
      pvVar34 = *(void **)((long)local_4c0 + lVar64 + 0xf8);
      if (pvVar34 != (void *)0x0) {
        *(undefined8 *)((long)local_4c0 + lVar64 + 0xf0) = 0;
        ImGui::MemFree(pvVar34);
        *(undefined8 *)((long)local_4c0 + lVar64 + 0xf8) = 0;
      }
      if (*(int *)((long)local_4c0 + lVar64 + 0x100) != *(int *)((long)local_4c0 + lVar64 + 0xe8)) {
        __assert_fail("src_tmp.GlyphsList.Size == src_tmp.GlyphsCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_draw.cpp"
                      ,0x987,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      lVar64 = local_438._0_8_ + 1;
    } while (lVar64 != lVar41);
  }
  pvVar34 = local_418;
  uVar11 = local_2d8._0_8_;
  if (0 < (int)local_3c8._0_4_) {
    lVar64 = 0;
    do {
      pvVar33 = *(void **)((long)pvVar34 + lVar64 + 0x18);
      if (pvVar33 != (void *)0x0) {
        *(undefined8 *)((long)pvVar34 + lVar64 + 0x10) = 0;
        ImGui::MemFree(pvVar33);
        *(undefined8 *)((long)pvVar34 + lVar64 + 0x18) = 0;
      }
      lVar64 = lVar64 + 0x20;
    } while (uVar11 != lVar64);
  }
  if (local_418 != (void *)0x0) {
    ImGui::MemFree(local_418);
    local_418 = (void *)0x0;
  }
  local_458._0_16_ = ZEXT816(0);
  local_408 = 0;
  pvStack_400 = (void *)0x0;
  if (0 < (int)uVar27) {
    uVar55 = 8;
    if (7 < (int)uVar27) {
      uVar55 = uVar27;
    }
    if (0 < (int)uVar55) {
      pvVar34 = ImGui::MemAlloc((long)(int)uVar55 * 0x18);
      if ((void *)local_458._8_8_ != (void *)0x0) {
        memcpy(pvVar34,(void *)local_458._8_8_,(long)(int)local_458._0_4_ * 0x18);
        ImGui::MemFree((void *)local_458._8_8_);
      }
      auVar14._4_8_ = pvVar34;
      auVar14._0_4_ = uVar55;
      auVar14._12_4_ = 0;
      local_458._0_16_ = auVar14 << 0x20;
    }
  }
  local_458._0_4_ = uVar27;
  if (local_408._4_4_ < (int)uVar27) {
    if (local_408._4_4_ == 0) {
      uVar55 = 8;
    }
    else {
      uVar55 = local_408._4_4_ / 2 + local_408._4_4_;
    }
    if ((int)uVar55 <= (int)uVar27) {
      uVar55 = uVar27;
    }
    if (local_408._4_4_ < (int)uVar55) {
      pvVar34 = ImGui::MemAlloc((long)(int)uVar55 * 0x1c);
      if (pvStack_400 != (void *)0x0) {
        memcpy(pvVar34,pvStack_400,(long)(int)(stbtt_uint32)local_408 * 0x1c);
        ImGui::MemFree(pvStack_400);
      }
      local_408 = (ulong)uVar55 << 0x20;
      pvStack_400 = pvVar34;
    }
  }
  local_408 = CONCAT44(local_408._4_4_,uVar27);
  iVar28 = 0;
  memset((void *)local_458._8_8_,0,(long)(int)local_458._0_4_ * 0x18);
  memset(pvStack_400,0,(long)(int)(stbtt_uint32)local_408 * 0x1c);
  fVar69 = 0.0;
  if (0 < (int)uVar5) {
    lVar64 = 0;
    uVar31 = 0;
    uVar27 = 0;
    do {
      iVar63 = *(int *)((long)local_4c0 + lVar64 * 0x110 + 0xe8);
      if (iVar63 != 0) {
        iVar30 = (int)uVar31;
        if ((iVar30 < 0) || ((int)local_458._0_4_ <= iVar30)) {
          __function = "T &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]";
          goto LAB_00189a77;
        }
        psVar67 = (stbtt_fontinfo *)(lVar64 * 0x110 + (long)local_4c0);
        *(ulong *)&psVar67[1].hmtx = uVar31 * 0x18 + local_458._8_8_;
        if (((int)uVar27 < 0) || ((int)(stbtt_uint32)local_408 <= (int)uVar27)) {
          __function = "T &ImVector<stbtt_packedchar>::operator[](int) [T = stbtt_packedchar]";
          goto LAB_00189a77;
        }
        pvVar34 = (void *)((ulong)uVar27 * 0x1c + (long)pvStack_400);
        *(void **)&psVar67[1].gpos = pvVar34;
        if ((atlas->ConfigData).Size <= lVar64) goto LAB_00189b3b;
        pIVar61 = (atlas->ConfigData).Data;
        fVar69 = pIVar61[lVar64].SizePixels;
        *(float *)&psVar67[1].userdata = fVar69;
        *(undefined4 *)((long)&psVar67[1].userdata + 4) = 0;
        psVar67[1].data = *(uchar **)&psVar67[1].gsubrs.cursor;
        psVar67[1].fontstart = *(int *)&psVar67[1].gsubrs.data;
        *(void **)&psVar67[1].loca = pvVar34;
        *(char *)&psVar67[1].glyf = (char)pIVar61[lVar64].OversampleH;
        *(char *)((long)&psVar67[1].glyf + 1) = (char)pIVar61[lVar64].OversampleV;
        if (fVar69 <= 0.0) {
          fVar69 = -fVar69;
          uVar55 = (uint)(ushort)(*(ushort *)(psVar67->data + (long)psVar67->head + 0x12) << 8 |
                                 *(ushort *)(psVar67->data + (long)psVar67->head + 0x12) >> 8);
        }
        else {
          puVar35 = psVar67->data;
          lVar59 = (long)psVar67->hhea;
          uVar55 = ((int)(short)((ushort)puVar35[lVar59 + 4] << 8) | (uint)puVar35[lVar59 + 5]) -
                   ((int)(short)((ushort)puVar35[lVar59 + 6] << 8) | (uint)puVar35[lVar59 + 7]);
        }
        fVar69 = fVar69 / (float)(int)uVar55;
        uVar31 = (ulong)(uint)(iVar30 + iVar63);
        uVar27 = uVar27 + iVar63;
        if (0 < *(int *)&psVar67[1].gsubrs.data) {
          local_438._0_4_ = uVar27;
          local_468._0_8_ = lVar64;
          iVar40 = atlas->TexGlyphPadding + -1;
          lVar51 = 2;
          lVar59 = 0;
          do {
            if (*(int *)&psVar67[1].gsubrs.data <= lVar59) goto LAB_00189a62;
            iVar29 = stbtt_FindGlyphIndex
                               (psVar67,*(int *)(*(long *)&psVar67[1].gsubrs.cursor + lVar59 * 4));
            if (iVar29 == 0) {
              __assert_fail("glyph_index_in_font != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_draw.cpp"
                            ,0x9b6,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
            }
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar67,iVar29,(float)pIVar61[lVar64].OversampleH * fVar69,
                       (float)pIVar61[lVar64].OversampleV * fVar69,fVar69,in_XMM3_Da,
                       (int *)local_258,(int *)local_478,(int *)&local_3d8,(int *)&local_47c);
            iVar29 = (((stbtt_uint32)local_3d8 + iVar40) - (int)local_258[0].data) +
                     pIVar61[lVar64].OversampleH;
            lVar49 = *(long *)&psVar67[1].hmtx;
            *(int *)(lVar49 + -4 + lVar51 * 4) = iVar29;
            iVar48 = ((local_47c + iVar40) - local_478._0_4_) + pIVar61[lVar64].OversampleV;
            *(int *)(lVar49 + lVar51 * 4) = iVar48;
            iVar28 = iVar28 + iVar48 * iVar29;
            lVar59 = lVar59 + 1;
            lVar51 = lVar51 + 6;
          } while (lVar59 < *(int *)&psVar67[1].gsubrs.data);
          uVar31 = (ulong)(uint)(iVar30 + iVar63);
          lVar64 = local_468._0_8_;
          uVar27 = local_438._0_4_;
        }
      }
      lVar64 = lVar64 + 1;
    } while (lVar64 != lVar41);
    fVar69 = (float)iVar28;
  }
  if (fVar69 < 0.0) {
    fVar69 = sqrtf(fVar69);
  }
  else {
    fVar69 = SQRT(fVar69);
  }
  atlas->TexHeight = 0;
  iVar28 = atlas->TexDesiredWidth;
  if (iVar28 < 1) {
    iVar63 = (int)fVar69;
    iVar28 = 0x1000;
    if ((iVar63 < 0xb33) && (iVar28 = 0x800, iVar63 < 0x599)) {
      iVar28 = (uint)(0x2cb < iVar63) * 0x200 + 0x200;
    }
  }
  atlas->TexWidth = iVar28;
  local_478._8_4_ = atlas->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar63 = iVar28 - local_478._8_4_;
  local_3f0 = (stbrp_node *)ImGui::MemAlloc((long)iVar63 << 4);
  if ((ptr == (stbrp_context *)0x0) || (local_3f0 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (local_3f0 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_3f0);
    }
    local_3f0 = (stbrp_node *)0x0;
    local_478._8_4_ = 0.0;
    iVar28 = 0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    if (iVar63 < 2) {
      uVar31 = 0;
    }
    else {
      uVar31 = 0;
      psVar10 = local_3f0;
      do {
        uVar31 = uVar31 + 1;
        psVar10->next = psVar10 + 1;
        psVar10 = psVar10 + 1;
      } while (iVar63 - 1 != uVar31);
      uVar31 = uVar31 & 0xffffffff;
    }
    local_3f0[uVar31].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = local_3f0;
    ptr->active_head = ptr->extra;
    ptr->width = iVar63;
    ptr->height = 0x8000 - local_478._8_4_;
    ptr->num_nodes = iVar63;
    ptr->align = (iVar63 * 2 + -1) / iVar63;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = iVar63;
    ptr->extra[1].y = 0x40000000;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_310 = ptr;
  ImFontAtlasBuildPackCustomRects(atlas,ptr);
  if (0 < (int)uVar5) {
    lVar64 = 0;
    do {
      lVar59 = lVar64 * 0x110;
      iVar63 = *(int *)((long)local_4c0 + lVar59 + 0xe8);
      if (iVar63 != 0) {
        stbrp_pack_rects(local_310,*(stbrp_rect **)((long)local_4c0 + lVar59 + 200),iVar63);
        lVar51 = (long)*(int *)((long)local_4c0 + lVar59 + 0xe8);
        if (0 < lVar51) {
          lVar59 = *(long *)((long)local_4c0 + lVar59 + 200);
          lVar49 = 0;
          do {
            if (*(int *)(lVar59 + 0x14 + lVar49) != 0) {
              iVar63 = *(int *)(lVar59 + 8 + lVar49) + *(int *)(lVar59 + 0x10 + lVar49);
              if (iVar63 < atlas->TexHeight) {
                iVar63 = atlas->TexHeight;
              }
              atlas->TexHeight = iVar63;
            }
            lVar49 = lVar49 + 0x18;
          } while (lVar51 * 0x18 != lVar49);
        }
      }
      lVar64 = lVar64 + 1;
    } while (lVar64 != lVar41);
  }
  uVar27 = atlas->TexHeight;
  if ((atlas->Flags & 1) == 0) {
    uVar27 = (int)(uVar27 - 1) >> 1 | uVar27 - 1;
    uVar27 = (int)uVar27 >> 2 | uVar27;
    uVar27 = (int)uVar27 >> 4 | uVar27;
    uVar27 = (int)uVar27 >> 8 | uVar27;
    uVar27 = (int)uVar27 >> 0x10 | uVar27;
  }
  iVar30 = uVar27 + 1;
  atlas->TexHeight = iVar30;
  iVar63 = atlas->TexWidth;
  (atlas->TexUvScale).x = 1.0 / (float)iVar63;
  (atlas->TexUvScale).y = 1.0 / (float)iVar30;
  puVar35 = (uchar *)ImGui::MemAlloc((long)(iVar30 * iVar63));
  atlas->TexPixelsAlpha8 = puVar35;
  memset(puVar35,0,(long)atlas->TexHeight * (long)atlas->TexWidth);
  if (0 < (int)uVar5) {
    local_388 = atlas->TexPixelsAlpha8;
    lVar64 = (long)iVar28;
    lVar59 = 0;
    local_340 = iVar28;
    do {
      local_398 = lVar59;
      if ((atlas->ConfigData).Size <= lVar59) goto LAB_00189b3b;
      if (*(int *)((long)local_4c0 + lVar59 * 0x110 + 0xe8) != 0) {
        psVar67 = (stbtt_fontinfo *)(lVar59 * 0x110 + (long)local_4c0);
        local_2e8 = *(float *)&psVar67[1].userdata;
        if (local_2e8 <= 0.0) {
          uStack_2e4 = 0x80000000;
          uStack_2e0 = 0x80000000;
          uStack_2dc = 0x80000000;
          local_2e8 = -local_2e8;
          uVar27 = (uint)(ushort)(*(ushort *)(psVar67->data + (long)psVar67->head + 0x12) << 8 |
                                 *(ushort *)(psVar67->data + (long)psVar67->head + 0x12) >> 8);
        }
        else {
          puVar35 = psVar67->data;
          lVar59 = (long)psVar67->hhea;
          uVar27 = ((int)(short)((ushort)puVar35[lVar59 + 4] << 8) | (uint)puVar35[lVar59 + 5]) -
                   ((int)(short)((ushort)puVar35[lVar59 + 6] << 8) | (uint)puVar35[lVar59 + 7]);
          uStack_2e4 = 0;
          uStack_2e0 = 0;
          uStack_2dc = 0;
        }
        local_2e8 = local_2e8 / (float)(int)uVar27;
        bVar84 = (byte)psVar67[1].glyf;
        fVar69 = (float)bVar84;
        local_3a4 = 0.0;
        local_3a8 = 0.0;
        if (bVar84 != 0) {
          local_3a8 = (float)(int)(1 - (uint)bVar84) / (fVar69 + fVar69);
        }
        bVar3 = *(byte *)((long)&psVar67[1].glyf + 1);
        fVar74 = (float)bVar3;
        if (bVar3 != 0) {
          local_3a4 = (float)(int)(1 - (uint)bVar3) / (fVar74 + fVar74);
        }
        local_2b8 = (atlas->ConfigData).Data;
        if (0 < psVar67[1].fontstart) {
          lVar59._0_4_ = psVar67[1].hmtx;
          lVar59._4_4_ = psVar67[1].kern;
          fVar72 = 1.0 / fVar69;
          local_350 = fVar72;
          local_354 = 1.0 / fVar74;
          local_3d0 = fVar69 * local_2e8;
          fVar74 = fVar74 * local_2e8;
          fVar69 = fVar74;
          if (local_3d0 <= fVar74) {
            fVar69 = local_3d0;
          }
          local_39c = (0.35 / fVar69) * (0.35 / fVar69);
          local_268 = ZEXT416((uint)fVar74);
          fVar74 = -fVar74;
          local_48 = fVar74;
          uStack_44 = 0x80000000;
          uStack_40 = 0x80000000;
          uStack_3c = 0x80000000;
          local_290 = (ulong)(uint)bVar84;
          local_298 = (ulong)(uint)bVar3;
          uVar42 = 0xffffffff;
          uVar31 = 0;
          local_308 = psVar67;
          local_3e0 = (ulong)bVar84;
          local_3e8 = (ulong)bVar3;
          local_2b0 = lVar59;
          do {
            iVar28 = *(int *)(lVar59 + 0x14 + uVar31 * 0x18);
            if (iVar28 != 0) {
              lVar51 = lVar59 + uVar31 * 0x18;
              if ((*(int *)(lVar51 + 4) == 0) || (*(int *)(lVar51 + 8) == 0)) {
                if ((iVar28 != 0) &&
                   (((*(int *)(lVar51 + 4) == 0 && (*(int *)(lVar51 + 8) == 0)) &&
                    (-1 < (int)(uint)uVar42)))) {
                  lVar51 = *(long *)&psVar67[1].loca;
                  puVar39 = (undefined8 *)(lVar51 + uVar42 * 0x1c);
                  uVar11 = *puVar39;
                  uVar12 = puVar39[1];
                  *(undefined1 (*) [16])(lVar51 + 0xc + uVar31 * 0x1c) =
                       *(undefined1 (*) [16])(lVar51 + 0xc + uVar42 * 0x1c);
                  puVar39 = (undefined8 *)(lVar51 + uVar31 * 0x1c);
                  *puVar39 = uVar11;
                  puVar39[1] = uVar12;
                }
              }
              else {
                if (psVar67[1].data == (uchar *)0x0) {
                  iVar28 = *(int *)((long)&psVar67[1].userdata + 4) + (int)uVar31;
                }
                else {
                  iVar28 = *(int *)(psVar67[1].data + uVar31 * 4);
                }
                local_2a8 = (short *)(uVar31 * 0x1c + *(long *)&psVar67[1].loca);
                local_344 = (uint)uVar42;
                local_2a0 = uVar31;
                uVar27 = stbtt_FindGlyphIndex(psVar67,iVar28);
                *(int *)(lVar51 + 0xc) = *(int *)(lVar51 + 0xc) + local_478._8_4_;
                *(int *)(lVar51 + 0x10) = *(int *)(lVar51 + 0x10) + local_478._8_4_;
                *(int *)(lVar51 + 4) = *(int *)(lVar51 + 4) - local_478._8_4_;
                *(int *)(lVar51 + 8) = *(int *)(lVar51 + 8) - local_478._8_4_;
                puVar35 = psVar67->data;
                uVar18 = *(ushort *)(puVar35 + (long)psVar67->hhea + 0x22) << 8 |
                         *(ushort *)(puVar35 + (long)psVar67->hhea + 0x22) >> 8;
                iVar28 = psVar67->hmtx;
                lVar59 = (ulong)uVar18 * 4 + (long)iVar28 + -4;
                lVar49 = (ulong)uVar18 * 4 + (long)iVar28 + -3;
                if ((int)uVar27 < (int)(uint)uVar18) {
                  lVar59 = (long)(int)(uVar27 * 4) + (long)iVar28;
                  lVar49 = (long)(int)(uVar27 * 4) + 1 + (long)iVar28;
                }
                local_348 = (uint)puVar35[lVar59];
                local_34c = (uint)puVar35[lVar49];
                stbtt_GetGlyphBitmapBoxSubpixel
                          (psVar67,uVar27,local_3d0,(float)local_268._0_4_,fVar72,fVar74,&local_330,
                           &local_334,&local_26c,&local_270);
                local_438._0_8_ = (long)*(int *)(lVar51 + 0xc);
                local_378 = (uchar *)(long)*(int *)(lVar51 + 0x10);
                local_3b0 = (ulong)*(uint *)(lVar51 + 4);
                local_390 = (ulong)*(uint *)(lVar51 + 8);
                local_380 = lVar51;
                local_2f8 = (ulong)uVar27;
                iVar28 = stbtt_GetGlyphShape(psVar67,uVar27,(stbtt_vertex **)&local_3d8);
                local_468._0_4_ = iVar28;
                fVar69 = (float)(((int)local_3b0 - (int)local_3e0) + 1);
                stbtt_GetGlyphBitmapBoxSubpixel
                          (local_308,(int)local_2f8,local_3d0,(float)local_268._0_4_,fVar72,fVar74,
                           (int *)&local_47c,&local_32c,(int *)0x0,(int *)0x0);
                sVar26 = local_47c;
                local_478._12_4_ = fVar69;
                if (fVar69 != 0.0) {
                  iVar28 = ((int)local_390 - (int)local_3e8) + 1;
                  local_3c8._0_4_ = iVar28;
                  if (iVar28 != 0) {
                    lVar59 = CONCAT44(local_3d8._4_4_,(stbtt_uint32)local_3d8);
                    local_258[0].data = (uchar *)((ulong)local_258[0].data & 0xffffffff00000000);
                    uVar31 = (ulong)(uint)local_468._0_4_;
                    if ((int)local_468._0_4_ < 1) {
                      uVar42 = 0;
                    }
                    else {
                      lVar51 = 0;
                      uVar42 = 0;
                      do {
                        uVar42 = (ulong)((int)uVar42 +
                                        (uint)(*(char *)(lVar59 + 0xc + lVar51) == '\x01'));
                        lVar51 = lVar51 + 0xe;
                      } while (uVar31 * 0xe != lVar51);
                    }
                    local_3a0 = local_32c;
                    if ((int)uVar42 == 0) {
LAB_001880cf:
                      local_440 = (void *)0x0;
LAB_001880db:
                      points = (stbtt__point *)0x0;
                    }
                    else {
                      local_440 = ImGui::MemAlloc((long)(int)uVar42 << 2);
                      if (local_440 == (void *)0x0) {
                        uVar42 = 0;
                        goto LAB_001880db;
                      }
                      lVar51 = uVar31 * 0xe;
                      iVar63 = 0;
                      points = (stbtt__point *)0x0;
                      iVar28 = 0;
                      lVar49 = lVar51;
                      do {
                        if (iVar28 == 0) {
LAB_00187e90:
                          local_258[0].data =
                               (uchar *)((ulong)local_258[0].data & 0xffffffff00000000);
                          if ((int)local_468._0_4_ < 1) {
                            lVar52 = -1;
                          }
                          else {
                            uVar27 = 0xffffffff;
                            fVar74 = 0.0;
                            lVar52 = 0;
                            fVar69 = 0.0;
                            do {
                              puVar35 = local_258[0].data;
                              switch(*(undefined1 *)(lVar59 + 0xc + lVar52)) {
                              case 1:
                                if (-1 < (int)uVar27) {
                                  *(int *)((long)local_440 + (ulong)uVar27 * 4) =
                                       (int)local_258[0].data - iVar63;
                                }
                                uVar27 = uVar27 + 1;
                                sVar19 = *(short *)(lVar59 + lVar52);
                                sVar47 = *(short *)(lVar59 + 2 + lVar52);
                                iVar63 = (int)local_258[0].data;
                                break;
                              case 2:
                                sVar19 = *(short *)(lVar59 + lVar52);
                                sVar47 = *(short *)(lVar59 + 2 + lVar52);
                                break;
                              case 3:
                                lVar51 = lVar49;
                                stbtt__tesselate_curve
                                          (points,(int *)local_258,fVar69,fVar74,
                                           (float)(int)*(short *)(lVar59 + 4 + lVar52),
                                           (float)(int)*(short *)(lVar59 + 6 + lVar52),
                                           (float)(int)*(short *)(lVar59 + lVar52),
                                           (float)(int)*(short *)(lVar59 + 2 + lVar52),local_39c,0);
                                goto LAB_00187ffc;
                              case 4:
                                stbtt__tesselate_cubic
                                          (points,(int *)local_258,fVar69,fVar74,
                                           (float)(int)*(short *)(lVar59 + 4 + lVar52),
                                           (float)(int)*(short *)(lVar59 + 6 + lVar52),
                                           (float)(int)*(short *)(lVar59 + 8 + lVar52),
                                           (float)(int)*(short *)(lVar59 + 10 + lVar52),
                                           (float)(int)*(short *)(lVar59 + lVar52),
                                           (float)(int)*(short *)(lVar59 + 2 + lVar52),local_39c,0);
                                lVar51 = lVar49;
LAB_00187ffc:
                                fVar69 = (float)(int)*(short *)(lVar59 + lVar52);
                                fVar74 = (float)(int)*(short *)(lVar59 + 2 + lVar52);
                                puVar35 = local_258[0].data;
                                lVar49 = lVar51;
                              default:
                                goto switchD_00187ed8_default;
                              }
                              puVar35 = (uchar *)CONCAT44(local_258[0].data._4_4_,
                                                          (int)local_258[0].data + 1);
                              fVar74 = (float)(int)sVar47;
                              fVar69 = (float)(int)sVar19;
                              if (points != (stbtt__point *)0x0) {
                                points[(int)local_258[0].data].x = fVar69;
                                points[(int)local_258[0].data].y = fVar74;
                              }
switchD_00187ed8_default:
                              local_258[0].data = puVar35;
                              lVar52 = lVar52 + 0xe;
                            } while (lVar51 != lVar52);
                            lVar52 = (long)(int)uVar27;
                          }
                          *(int *)((long)local_440 + lVar52 * 4) = (int)local_258[0].data - iVar63;
                          bVar17 = true;
                        }
                        else {
                          lVar51 = lVar49;
                          points = (stbtt__point *)
                                   ImGui::MemAlloc((long)(int)local_258[0].data << 3);
                          lVar49 = lVar51;
                          if (points != (stbtt__point *)0x0) goto LAB_00187e90;
                          points = (stbtt__point *)0x0;
                          bVar17 = false;
                        }
                        if (!bVar17) {
                          ImGui::MemFree(points);
                          ImGui::MemFree(local_440);
                          uVar42 = 0;
                          goto LAB_001880cf;
                        }
                        bVar17 = iVar28 == 0;
                        iVar28 = iVar28 + 1;
                      } while (bVar17);
                    }
                    if (points != (stbtt__point *)0x0) {
                      if ((int)uVar42 < 1) {
                        size = 0x14;
                      }
                      else {
                        uVar31 = 0;
                        lVar59 = 0;
                        do {
                          lVar59 = (long)(int)lVar59 + (long)*(int *)((long)local_440 + uVar31 * 4);
                          uVar31 = uVar31 + 1;
                        } while (uVar42 != uVar31);
                        size = lVar59 * 0x14 + 0x14;
                      }
                      p_00 = (stbtt__edge *)ImGui::MemAlloc(size);
                      if (p_00 != (stbtt__edge *)0x0) {
                        if ((int)uVar42 < 1) {
                          uVar31 = 0;
                        }
                        else {
                          uVar58 = 0;
                          uVar31 = 0;
                          iVar28 = 0;
                          do {
                            iVar63 = *(int *)((long)local_440 + uVar58 * 4);
                            if (0 < iVar63) {
                              uVar62 = (ulong)(iVar63 - 1);
                              uVar50 = 0;
                              do {
                                iVar30 = (int)uVar62;
                                fVar69 = points[(long)iVar28 + (long)iVar30].y;
                                fVar74 = points[(long)iVar28 + uVar50].y;
                                if ((fVar69 != fVar74) || (NAN(fVar69) || NAN(fVar74))) {
                                  iVar29 = (int)uVar50;
                                  iVar40 = iVar30;
                                  if (fVar69 <= fVar74) {
                                    iVar40 = iVar29;
                                    iVar29 = iVar30;
                                  }
                                  iVar30 = (int)uVar31;
                                  p_00[iVar30].invert = (uint)(fVar74 < fVar69);
                                  p_00[iVar30].x0 =
                                       points[(long)iVar28 + (long)iVar40].x * local_3d0 + 0.0;
                                  p_00[iVar30].y0 =
                                       points[(long)iVar28 + (long)iVar40].y * local_48 + 0.0;
                                  p_00[iVar30].x1 =
                                       points[(long)iVar28 + (long)iVar29].x * local_3d0 + 0.0;
                                  p_00[iVar30].y1 =
                                       points[(long)iVar28 + (long)iVar29].y * local_48 + 0.0;
                                  uVar31 = (ulong)(iVar30 + 1);
                                }
                                uVar62 = uVar50 & 0xffffffff;
                                uVar50 = uVar50 + 1;
                              } while ((long)uVar50 < (long)*(int *)((long)local_440 + uVar58 * 4));
                            }
                            iVar28 = iVar28 + iVar63;
                            uVar58 = uVar58 + 1;
                          } while (uVar58 != uVar42);
                        }
                        iVar28 = (int)uVar31;
                        local_300 = points;
                        stbtt__sort_edges_quicksort(p_00,iVar28);
                        if (1 < iVar28) {
                          uVar42 = 1;
                          do {
                            fVar69 = p_00[uVar42].x0;
                            fVar74 = p_00[uVar42].y0;
                            iVar63 = p_00[uVar42].invert;
                            local_258[0].cursor = iVar63;
                            local_258[0].data = *(uchar **)&p_00[uVar42].x1;
                            uVar58 = uVar42 & 0xffffffff;
                            do {
                              uVar27 = (uint)uVar58;
                              if ((int)uVar27 < 1) break;
                              fVar72 = p_00[uVar58 - 1].y0;
                              if (fVar74 < fVar72) {
                                psVar66 = p_00 + uVar58;
                                psVar66->invert = psVar66[-1].invert;
                                fVar73 = psVar66[-1].y0;
                                fVar77 = psVar66[-1].x1;
                                fVar81 = psVar66[-1].y1;
                                psVar66->x0 = psVar66[-1].x0;
                                psVar66->y0 = fVar73;
                                psVar66->x1 = fVar77;
                                psVar66->y1 = fVar81;
                                uVar58 = (ulong)(uVar27 - 1);
                              }
                              uVar27 = (uint)uVar58;
                            } while (fVar74 < fVar72);
                            if (uVar42 != uVar27) {
                              p_00[(int)uVar27].x0 = fVar69;
                              p_00[(int)uVar27].y0 = fVar74;
                              *(uchar **)&p_00[(int)uVar27].x1 = local_258[0].data;
                              p_00[(int)uVar27].invert = iVar63;
                            }
                            uVar42 = uVar42 + 1;
                          } while (uVar42 != uVar31);
                        }
                        local_478._0_8_ = (stbtt__active_edge *)0x0;
                        scanline = local_258;
                        if (0x40 < (int)local_478._12_4_) {
                          scanline = (stbtt__buf *)
                                     ImGui::MemAlloc((ulong)(uint)local_478._12_4_ * 8 + 4);
                        }
                        uVar27 = (int)local_390 - (uint)local_3e8;
                        local_390 = (ulong)uVar27;
                        p_00[iVar28].y0 = (float)(local_3c8._0_4_ + local_3a0) + 1.0;
                        if (uVar27 < 0x7fffffff) {
                          local_378 = local_388 + (long)local_378 * lVar64 + local_438._0_8_;
                          uVar27 = (int)local_3b0 - (uint)local_3e0;
                          local_3b0 = (ulong)uVar27;
                          local_288 = (long)(int)local_478._12_4_;
                          local_338 = (float)(int)sVar26;
                          local_360 = (float *)((long)&scanline->data + local_288 * 4);
                          local_2f0 = local_360 + 1;
                          local_278 = local_288 * 4;
                          local_3cc = (float)(int)local_478._12_4_;
                          local_280 = (long)(int)(uVar27 + 2) << 2;
                          local_370 = 0;
                          local_368 = 0;
                          local_3b8 = (undefined8 *)0x0;
                          local_41c = 0;
                          local_410 = (stbtt__active_edge *)0x0;
                          psVar66 = p_00;
                          local_33c = local_3a0;
                          do {
                            fVar74 = (float)local_33c;
                            fVar69 = fVar74 + 1.0;
                            memset(scanline,0,local_278);
                            memset(local_360,0,local_280);
                            psVar38 = local_410;
                            if ((stbtt__active_edge *)local_478._0_8_ != (stbtt__active_edge *)0x0)
                            {
                              psVar36 = (stbtt__active_edge *)local_478._0_8_;
                              psVar45 = (stbtt__active_edge *)local_478;
                              do {
                                psVar46 = psVar36;
                                if (psVar36->ey <= fVar74) {
                                  psVar45->next = psVar36->next;
                                  if ((psVar36->direction == 0.0) && (!NAN(psVar36->direction))) {
                                    __assert_fail("z->direction",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imstb_truetype.h"
                                                  ,0xd08,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                 );
                                  }
                                  psVar36->direction = 0.0;
                                  psVar36->next = psVar38;
                                  psVar46 = psVar45;
                                  psVar38 = psVar36;
                                }
                                psVar36 = psVar46->next;
                                psVar45 = psVar46;
                              } while (psVar36 != (stbtt__active_edge *)0x0);
                            }
                            fVar72 = psVar66->y0;
                            if (fVar72 <= fVar69) {
                              bVar17 = local_3a0 != 0;
                              bVar68 = (int)local_368 == 0;
                              do {
                                if ((fVar72 != psVar66->y1) || (NAN(fVar72) || NAN(psVar66->y1))) {
                                  if (psVar38 == (stbtt__active_edge *)0x0) {
                                    if (local_41c == 0) {
                                      puVar39 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                      if (puVar39 == (undefined8 *)0x0) {
                                        local_410 = psVar38;
                                        psVar38 = (stbtt__active_edge *)0x0;
                                        goto LAB_00188d08;
                                      }
                                      *puVar39 = local_3b8;
                                      local_41c = 800;
                                      local_3b8 = puVar39;
                                    }
                                    lVar59 = (long)local_41c;
                                    local_41c = local_41c + -1;
                                    local_410 = psVar38;
                                    psVar38 = (stbtt__active_edge *)(local_3b8 + lVar59 * 4 + -3);
                                  }
                                  else {
                                    local_410 = psVar38->next;
                                  }
LAB_00188d08:
                                  if (psVar38 == (stbtt__active_edge *)0x0) {
                                    __assert_fail("z != __null",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imstb_truetype.h"
                                                  ,0xb32,
                                                  "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                                 );
                                  }
                                  fVar72 = psVar66->x0;
                                  fVar73 = psVar66->y0;
                                  fVar77 = psVar66->y1;
                                  fVar81 = (psVar66->x1 - fVar72) / (fVar77 - fVar73);
                                  psVar38->fdx = fVar81;
                                  psVar38->fdy = (float)(-(uint)(fVar81 != 0.0) &
                                                        (uint)(1.0 / fVar81));
                                  psVar38->fx = ((fVar74 - fVar73) * fVar81 + fVar72) - local_338;
                                  psVar38->direction =
                                       *(float *)(&DAT_001edd5c + (ulong)(psVar66->invert == 0) * 4)
                                  ;
                                  psVar38->sy = fVar73;
                                  psVar38->ey = fVar77;
                                  psVar38->next = (stbtt__active_edge *)0x0;
                                  if (fVar77 < fVar74 && (bVar68 && bVar17)) {
                                    psVar38->ey = fVar74;
                                  }
                                  if (psVar38->ey < fVar74) {
                                    __assert_fail("z->ey >= scan_y_top",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imstb_truetype.h"
                                                  ,0xd1b,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                 );
                                  }
                                  psVar38->next = (stbtt__active_edge *)local_478._0_8_;
                                  local_478._0_8_ = psVar38;
                                }
                                else {
                                  local_410 = psVar38;
                                }
                                fVar72 = psVar66[1].y0;
                                psVar66 = psVar66 + 1;
                                psVar38 = local_410;
                                psVar36 = (stbtt__active_edge *)local_478._0_8_;
                                iVar28 = local_33c;
                              } while (fVar72 <= fVar69);
                            }
                            else {
                              local_410 = psVar38;
                              psVar36 = (stbtt__active_edge *)local_478._0_8_;
                              iVar28 = local_33c;
                            }
                            for (; psVar36 != (stbtt__active_edge *)0x0; psVar36 = psVar36->next) {
                              fVar72 = psVar36->ey;
                              local_33c = iVar28;
                              if (fVar72 < fVar74) {
                                __assert_fail("e->ey >= y_top",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imstb_truetype.h"
                                              ,0xc17,
                                              "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                             );
                              }
                              fVar73 = psVar36->fx;
                              fVar77 = psVar36->fdx;
                              if ((fVar77 != 0.0) || (NAN(fVar77))) {
                                fVar81 = psVar36->sy;
                                if (fVar69 < fVar81) {
                                  __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imstb_truetype.h"
                                                ,0xc2a,
                                                "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                               );
                                }
                                fVar79 = fVar77 + fVar73;
                                fVar76 = (float)(~-(uint)(fVar74 < fVar81) & (uint)fVar73 |
                                                (uint)((fVar81 - fVar74) * fVar77 + fVar73) &
                                                -(uint)(fVar74 < fVar81));
                                if ((((fVar76 < 0.0) ||
                                     (fVar78 = (float)(~-(uint)(fVar72 < fVar69) & (uint)fVar79 |
                                                      (uint)((fVar72 - fVar74) * fVar77 + fVar73) &
                                                      -(uint)(fVar72 < fVar69)), fVar78 < 0.0)) ||
                                    (local_3cc <= fVar76)) || (local_3cc <= fVar78)) {
                                  if ((uint)local_3b0 < 0x7fffffff) {
                                    local_2d8 = ZEXT416((uint)fVar77);
                                    local_3c8 = ZEXT416((uint)fVar79);
                                    local_328 = ZEXT416((uint)fVar73);
                                    fVar72 = 0.0;
                                    do {
                                      fVar76 = (float)(int)fVar72;
                                      fVar78 = (float)((int)fVar72 + 1);
                                      fVar70 = (float)(int)fVar78;
                                      fVar81 = (fVar76 - fVar73) / fVar77 + fVar74;
                                      fVar77 = (fVar70 - fVar73) / fVar77 + fVar74;
                                      local_468._0_4_ = fVar76;
                                      if ((fVar76 <= fVar73) || (fVar79 <= fVar70)) {
                                        if ((fVar79 < fVar76) && (fVar70 < fVar73)) {
                                          local_438._0_4_ = fVar77;
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,(int)fVar72,psVar36,fVar73,
                                                     fVar74,fVar70,fVar77);
                                          fVar73 = fVar70;
                                          fVar76 = (float)local_468._0_4_;
                                          fVar75 = (float)local_438._0_4_;
LAB_00188855:
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,(int)fVar72,psVar36,fVar73,
                                                     fVar75,fVar76,fVar81);
                                          fVar73 = (float)local_468._0_4_;
                                          goto LAB_0018886e;
                                        }
                                        fVar75 = fVar74;
                                        if (((fVar73 < fVar76) && (fVar76 < fVar79)) ||
                                           ((fVar79 < fVar76 && (fVar76 < fVar73))))
                                        goto LAB_00188855;
                                        fVar81 = fVar74;
                                        if (((fVar73 < fVar70) && (fVar70 < fVar79)) ||
                                           ((fVar79 < fVar70 && (fVar70 < fVar73)))) {
                                          local_438._0_4_ = fVar77;
                                          goto LAB_001887be;
                                        }
                                      }
                                      else {
                                        local_438._0_4_ = fVar77;
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,(int)fVar72,psVar36,fVar73,
                                                   fVar74,fVar76,fVar81);
                                        fVar73 = (float)local_468._0_4_;
                                        fVar77 = (float)local_438._0_4_;
LAB_001887be:
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,(int)fVar72,psVar36,fVar73,
                                                   fVar81,fVar70,fVar77);
                                        fVar73 = fVar70;
                                        fVar81 = (float)local_438._0_4_;
LAB_0018886e:
                                        fVar79 = (float)local_3c8._0_4_;
                                      }
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,(int)fVar72,psVar36,fVar73,fVar81
                                                 ,fVar79,fVar69);
                                      fVar73 = (float)local_328._0_4_;
                                      fVar77 = (float)local_2d8._0_4_;
                                      fVar79 = (float)local_3c8._0_4_;
                                      fVar72 = fVar78;
                                    } while ((float)local_478._12_4_ != fVar78);
                                  }
                                }
                                else {
                                  if (fVar81 <= fVar74) {
                                    fVar81 = fVar74;
                                  }
                                  uVar27 = (uint)fVar76;
                                  if (fVar69 <= fVar72) {
                                    fVar72 = fVar69;
                                  }
                                  if (uVar27 == (int)fVar78) {
                                    if (((int)uVar27 < 0) || ((int)local_478._12_4_ <= (int)uVar27))
                                    {
                                      __assert_fail("x >= 0 && x < len",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imstb_truetype.h"
                                                  ,0xc46,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                    }
                                    fVar80 = (fVar72 - fVar81) * psVar36->direction;
                                    fVar72 = stbtt__position_trapezoid_area
                                                       (fVar80,fVar76,(float)(int)uVar27 + 1.0,
                                                        fVar78,(float)(int)uVar27 + 1.0);
                                    uVar31 = (ulong)uVar27;
                                    *(float *)((long)&scanline->data + uVar31 * 4) =
                                         fVar72 + *(float *)((long)&scanline->data + uVar31 * 4);
                                  }
                                  else {
                                    fVar70 = psVar36->fdy;
                                    fVar75 = fVar78;
                                    if (fVar78 < fVar76) {
                                      fVar80 = fVar74 - fVar81;
                                      fVar81 = (fVar74 - fVar72) + fVar69;
                                      fVar77 = -fVar77;
                                      fVar70 = -fVar70;
                                      fVar75 = fVar76;
                                      fVar73 = fVar79;
                                      fVar72 = fVar80 + fVar69;
                                      fVar76 = fVar78;
                                    }
                                    if (fVar70 < 0.0) {
                                      __assert_fail("dy >= 0",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imstb_truetype.h"
                                                  ,0xc58,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                    }
                                    if (fVar77 < 0.0) {
                                      __assert_fail("dx >= 0",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imstb_truetype.h"
                                                  ,0xc59,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                    }
                                    iVar63 = (int)fVar75;
                                    iVar28 = (int)fVar76 + 1;
                                    fVar78 = ((float)iVar28 - fVar73) * fVar70 + fVar74;
                                    fVar79 = (float)(int)fVar75;
                                    fVar77 = fVar69;
                                    if (fVar78 <= fVar69) {
                                      fVar77 = fVar78;
                                    }
                                    fVar80 = psVar36->direction;
                                    fVar78 = (fVar77 - fVar81) * fVar80;
                                    lVar59 = (long)(int)fVar76;
                                    fVar73 = (fVar79 - fVar73) * fVar70 + fVar74;
                                    *(float *)((long)&scanline->data + lVar59 * 4) =
                                         ((float)iVar28 - fVar76) * fVar78 * 0.5 +
                                         *(float *)((long)&scanline->data + lVar59 * 4);
                                    if (iVar63 - iVar28 != 0 && iVar28 <= iVar63) {
                                      fVar77 = (float)(~-(uint)(fVar69 < fVar73) & (uint)fVar70 |
                                                      (uint)((fVar69 - fVar77) /
                                                            (float)(iVar63 - iVar28)) &
                                                      -(uint)(fVar69 < fVar73)) * fVar80;
                                      do {
                                        *(float *)((long)&scanline->data + lVar59 * 4 + 4) =
                                             fVar77 * 0.5 + fVar78 +
                                             *(float *)((long)&scanline->data + lVar59 * 4 + 4);
                                        fVar78 = fVar78 + fVar77;
                                        lVar59 = lVar59 + 1;
                                      } while (iVar63 + -1 != (int)lVar59);
                                    }
                                    if (1.01 < ABS(fVar78)) {
                                      __assert_fail("fabsf(area) <= 1.01f",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imstb_truetype.h"
                                                  ,0xc99,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                    }
                                    local_438 = ZEXT416((uint)fVar78);
                                    local_468._0_4_ = fVar81;
                                    fVar77 = fVar69;
                                    if (fVar73 <= fVar69) {
                                      fVar77 = fVar73;
                                    }
                                    if (fVar72 <= fVar77 + -0.01) {
                                      __assert_fail("sy1 > y_final-0.01f",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imstb_truetype.h"
                                                  ,0xc9a,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                    }
                                    fVar73 = stbtt__position_trapezoid_area
                                                       (fVar72 - fVar77,fVar79,fVar79 + 1.0,fVar75,
                                                        fVar79 + 1.0);
                                    uVar31 = (ulong)iVar63;
                                    *(float *)((long)&scanline->data + uVar31 * 4) =
                                         fVar73 * fVar80 + (float)local_438._0_4_ +
                                         *(float *)((long)&scanline->data + uVar31 * 4);
                                    fVar80 = (fVar72 - (float)local_468._0_4_) * fVar80;
                                  }
                                  local_2f0[uVar31] = fVar80 + local_2f0[uVar31];
                                }
                              }
                              else if (fVar73 < local_3cc) {
                                if (0.0 <= fVar73) {
                                  local_328 = ZEXT416((uint)fVar73);
                                  stbtt__handle_clipped_edge
                                            ((float *)scanline,(int)fVar73,psVar36,fVar73,fVar74,
                                             fVar73,fVar69);
                                  iVar28 = (int)fVar73 + 1;
                                  fVar73 = (float)local_328._0_4_;
                                }
                                else {
                                  iVar28 = 0;
                                }
                                stbtt__handle_clipped_edge
                                          (local_360,iVar28,psVar36,fVar73,fVar74,fVar73,fVar69);
                              }
                              iVar28 = local_33c;
                            }
                            psVar38 = (stbtt__active_edge *)local_478._0_8_;
                            if ((uint)local_3b0 < 0x7fffffff) {
                              fVar69 = 0.0;
                              psVar37 = scanline;
                              uVar31 = local_370;
                              lVar59 = local_288;
                              do {
                                fVar69 = fVar69 + *(float *)((long)&psVar37->data + local_288 * 4);
                                iVar63 = (int)(ABS(*(float *)&psVar37->data + fVar69) * 255.0 + 0.5)
                                ;
                                uVar57 = (uchar)iVar63;
                                if (0xfe < iVar63) {
                                  uVar57 = 0xff;
                                }
                                local_378[(int)uVar31] = uVar57;
                                uVar31 = (ulong)((int)uVar31 + 1);
                                psVar37 = (stbtt__buf *)((long)&psVar37->data + 4);
                                lVar59 = lVar59 + -1;
                              } while (lVar59 != 0);
                            }
                            for (; psVar38 != (stbtt__active_edge *)0x0; psVar38 = psVar38->next) {
                              psVar38->fx = psVar38->fdx + psVar38->fx;
                            }
                            local_33c = iVar28 + 1;
                            iVar63 = (int)local_368;
                            local_368 = (ulong)(iVar63 + 1);
                            local_370 = (ulong)(uint)((int)local_370 + local_340);
                            puVar39 = local_3b8;
                            psVar15 = local_300;
                          } while (iVar63 != (int)local_390);
                        }
                        else {
                          local_3b8 = (undefined8 *)0x0;
                          puVar39 = local_3b8;
                          iVar28 = local_33c;
                          psVar15 = local_300;
                        }
                        while (local_33c = iVar28, points = local_300, local_300 = psVar15,
                              puVar39 != (undefined8 *)0x0) {
                          puVar8 = (undefined8 *)*puVar39;
                          ImGui::MemFree(puVar39);
                          puVar39 = puVar8;
                          iVar28 = local_33c;
                          psVar15 = local_300;
                          local_300 = points;
                        }
                        if (scanline != local_258) {
                          ImGui::MemFree(scanline);
                        }
                        ImGui::MemFree(p_00);
                      }
                      ImGui::MemFree(local_440);
                      ImGui::MemFree(points);
                    }
                  }
                }
                ImGui::MemFree((void *)CONCAT44(local_3d8._4_4_,(stbtt_uint32)local_3d8));
                if (1 < (byte)local_3e0) {
                  iVar28 = *(int *)(local_380 + 4);
                  iVar63 = *(int *)(local_380 + 8);
                  local_258[0].data = (uchar *)0x0;
                  if (0 < iVar63) {
                    puVar35 = local_388 +
                              *(int *)(local_380 + 0x10) * lVar64 + (long)*(int *)(local_380 + 0xc);
                    iVar40 = iVar28 - (uint)local_3e0;
                    uVar31 = (ulong)(iVar40 + 1);
                    iVar30 = 0;
                    do {
                      uVar42 = local_3e0;
                      memset(local_258,0,local_3e0);
                      switch((int)uVar42) {
                      case 2:
                        if (iVar40 < 0) {
LAB_00189091:
                          uVar58 = 0;
                          uVar42 = 0;
                        }
                        else {
                          uVar58 = 0;
                          uVar42 = 0;
                          do {
                            bVar84 = puVar35[uVar58];
                            bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar58 & 7));
                            *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar58 + 2 & 7)) =
                                 bVar84;
                            uVar27 = (int)uVar42 + ((uint)bVar84 - (uint)bVar3);
                            uVar42 = (ulong)uVar27;
                            puVar35[uVar58] = (uchar)(uVar27 >> 1);
                            uVar58 = uVar58 + 1;
                          } while (uVar31 != uVar58);
                        }
                        break;
                      case 3:
                        if (iVar40 < 0) goto LAB_00189091;
                        uVar58 = 0;
                        uVar42 = 0;
                        do {
                          bVar84 = puVar35[uVar58];
                          bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar58 & 7));
                          *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar58 + 3 & 7)) =
                               bVar84;
                          uVar42 = (ulong)((int)uVar42 + ((uint)bVar84 - (uint)bVar3));
                          puVar35[uVar58] = (uchar)(uVar42 / 3);
                          uVar58 = uVar58 + 1;
                        } while (uVar31 != uVar58);
                        break;
                      case 4:
                        if (iVar40 < 0) goto LAB_00189091;
                        uVar58 = 0;
                        uVar42 = 0;
                        do {
                          bVar84 = puVar35[uVar58];
                          uVar50 = (ulong)((uint)uVar58 & 7);
                          bVar3 = *(byte *)((long)&local_258[0].data + uVar50);
                          *(byte *)((long)&local_258[0].data + (uVar50 ^ 4)) = bVar84;
                          uVar27 = (int)uVar42 + ((uint)bVar84 - (uint)bVar3);
                          uVar42 = (ulong)uVar27;
                          puVar35[uVar58] = (uchar)(uVar27 >> 2);
                          uVar58 = uVar58 + 1;
                        } while (uVar31 != uVar58);
                        break;
                      case 5:
                        if (iVar40 < 0) goto LAB_00189091;
                        uVar58 = 0;
                        uVar42 = 0;
                        do {
                          bVar84 = puVar35[uVar58];
                          bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar58 & 7));
                          *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar58 + 5 & 7)) =
                               bVar84;
                          uVar42 = (ulong)((int)uVar42 + ((uint)bVar84 - (uint)bVar3));
                          puVar35[uVar58] = (uchar)(uVar42 / 5);
                          uVar58 = uVar58 + 1;
                        } while (uVar31 != uVar58);
                        break;
                      default:
                        if (iVar40 < 0) goto LAB_00189091;
                        uVar58 = 0;
                        uVar42 = 0;
                        do {
                          bVar84 = puVar35[uVar58];
                          bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar58 & 7));
                          *(byte *)((long)&local_258[0].data +
                                   (ulong)((int)local_290 + (uint)uVar58 & 7)) = bVar84;
                          uVar42 = (ulong)((int)uVar42 + ((uint)bVar84 - (uint)bVar3));
                          puVar35[uVar58] = (uchar)(uVar42 / (local_3e0 & 0xffffffff));
                          uVar58 = uVar58 + 1;
                        } while (uVar31 != uVar58);
                      }
                      if ((int)uVar58 < iVar28) {
                        uVar58 = uVar58 & 0xffffffff;
                        do {
                          if (puVar35[uVar58] != '\0') {
                            __assert_fail("pixels[i] == 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imstb_truetype.h"
                                          ,0xfe6,
                                          "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                                         );
                          }
                          uVar27 = (int)uVar42 -
                                   (uint)*(byte *)((long)&local_258[0].data +
                                                  (ulong)((uint)uVar58 & 7));
                          uVar42 = (ulong)uVar27;
                          puVar35[uVar58] = (uchar)(uVar27 / (uint)local_3e0);
                          uVar58 = uVar58 + 1;
                        } while ((int)uVar58 < iVar28);
                      }
                      puVar35 = puVar35 + lVar64;
                      iVar30 = iVar30 + 1;
                    } while (iVar30 != iVar63);
                  }
                }
                if (1 < (byte)local_3e8) {
                  iVar28 = *(int *)(local_380 + 4);
                  iVar63 = *(int *)(local_380 + 8);
                  local_258[0].data = (uchar *)0x0;
                  if (0 < iVar28) {
                    pbVar53 = local_388 +
                              *(int *)(local_380 + 0x10) * lVar64 + (long)*(int *)(local_380 + 0xc);
                    iVar40 = iVar63 - (uint)local_3e8;
                    uVar31 = (ulong)(iVar40 + 1);
                    iVar30 = 0;
                    do {
                      uVar42 = local_3e8;
                      memset(local_258,0,local_3e8);
                      switch((int)uVar42) {
                      case 2:
                        if (iVar40 < 0) {
LAB_0018932d:
                          uVar58 = 0;
                          uVar42 = 0;
                        }
                        else {
                          uVar58 = 0;
                          uVar42 = 0;
                          pbVar60 = pbVar53;
                          do {
                            bVar84 = *pbVar60;
                            bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar58 & 7));
                            *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar58 + 2 & 7)) =
                                 bVar84;
                            uVar27 = (int)uVar42 + ((uint)bVar84 - (uint)bVar3);
                            uVar42 = (ulong)uVar27;
                            *pbVar60 = (byte)(uVar27 >> 1);
                            uVar58 = uVar58 + 1;
                            pbVar60 = pbVar60 + lVar64;
                          } while (uVar31 != uVar58);
                        }
                        break;
                      case 3:
                        if (iVar40 < 0) goto LAB_0018932d;
                        uVar58 = 0;
                        uVar42 = 0;
                        pbVar60 = pbVar53;
                        do {
                          bVar84 = *pbVar60;
                          bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar58 & 7));
                          *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar58 + 3 & 7)) =
                               bVar84;
                          uVar42 = (ulong)((int)uVar42 + ((uint)bVar84 - (uint)bVar3));
                          *pbVar60 = (byte)(uVar42 / 3);
                          uVar58 = uVar58 + 1;
                          pbVar60 = pbVar60 + lVar64;
                        } while (uVar31 != uVar58);
                        break;
                      case 4:
                        if (iVar40 < 0) goto LAB_0018932d;
                        uVar58 = 0;
                        uVar42 = 0;
                        pbVar60 = pbVar53;
                        do {
                          bVar84 = *pbVar60;
                          uVar50 = (ulong)((uint)uVar58 & 7);
                          bVar3 = *(byte *)((long)&local_258[0].data + uVar50);
                          *(byte *)((long)&local_258[0].data + (uVar50 ^ 4)) = bVar84;
                          uVar27 = (int)uVar42 + ((uint)bVar84 - (uint)bVar3);
                          uVar42 = (ulong)uVar27;
                          *pbVar60 = (byte)(uVar27 >> 2);
                          uVar58 = uVar58 + 1;
                          pbVar60 = pbVar60 + lVar64;
                        } while (uVar31 != uVar58);
                        break;
                      case 5:
                        if (iVar40 < 0) goto LAB_0018932d;
                        uVar58 = 0;
                        uVar42 = 0;
                        pbVar60 = pbVar53;
                        do {
                          bVar84 = *pbVar60;
                          bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar58 & 7));
                          *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar58 + 5 & 7)) =
                               bVar84;
                          uVar42 = (ulong)((int)uVar42 + ((uint)bVar84 - (uint)bVar3));
                          *pbVar60 = (byte)(uVar42 / 5);
                          uVar58 = uVar58 + 1;
                          pbVar60 = pbVar60 + lVar64;
                        } while (uVar31 != uVar58);
                        break;
                      default:
                        if (iVar40 < 0) goto LAB_0018932d;
                        uVar58 = 0;
                        uVar42 = 0;
                        pbVar60 = pbVar53;
                        do {
                          bVar84 = *pbVar60;
                          bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar58 & 7));
                          *(byte *)((long)&local_258[0].data +
                                   (ulong)((int)local_298 + (uint)uVar58 & 7)) = bVar84;
                          uVar42 = (ulong)((int)uVar42 + ((uint)bVar84 - (uint)bVar3));
                          *pbVar60 = (byte)(uVar42 / (local_3e8 & 0xffffffff));
                          uVar58 = uVar58 + 1;
                          pbVar60 = pbVar60 + lVar64;
                        } while (uVar31 != uVar58);
                      }
                      iVar29 = (int)uVar58;
                      iVar48 = iVar63 - iVar29;
                      if (iVar48 != 0 && iVar29 <= iVar63) {
                        lVar59 = (long)iVar29;
                        pbVar60 = pbVar53 + lVar64 * lVar59;
                        do {
                          if (*pbVar60 != 0) {
                            __assert_fail("pixels[i*stride_in_bytes] == 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imstb_truetype.h"
                                          ,0x1024,
                                          "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)"
                                         );
                          }
                          uVar27 = (int)uVar42 -
                                   (uint)*(byte *)((long)&local_258[0].data +
                                                  (ulong)((uint)lVar59 & 7));
                          uVar42 = (ulong)uVar27;
                          *pbVar60 = (byte)(uVar27 / (uint)local_3e8);
                          lVar59 = lVar59 + 1;
                          pbVar60 = pbVar60 + lVar64;
                          iVar48 = iVar48 + -1;
                        } while (iVar48 != 0);
                      }
                      pbVar53 = pbVar53 + 1;
                      iVar30 = iVar30 + 1;
                    } while (iVar30 != iVar28);
                  }
                }
                sVar19 = (short)*(undefined4 *)(local_380 + 0xc);
                *local_2a8 = sVar19;
                sVar47 = (short)*(undefined4 *)(local_380 + 0x10);
                local_2a8[1] = sVar47;
                iVar28 = *(int *)(local_380 + 4);
                local_2a8[2] = sVar19 + (short)iVar28;
                iVar63 = *(int *)(local_380 + 8);
                local_2a8[3] = sVar47 + (short)iVar63;
                *(float *)(local_2a8 + 8) =
                     (float)(int)(short)((short)(local_348 << 8) + (short)local_34c) * local_2e8;
                *(float *)(local_2a8 + 4) = (float)local_330 * local_350 + local_3a8;
                *(float *)(local_2a8 + 6) = (float)local_334 * local_354 + local_3a4;
                *(float *)(local_2a8 + 10) = (float)(local_330 + iVar28) * local_350 + local_3a8;
                *(float *)(local_2a8 + 0xc) = (float)(local_334 + iVar63) * local_354 + local_3a4;
                uVar42 = (ulong)local_344;
                psVar67 = local_308;
                lVar59 = local_2b0;
                uVar31 = local_2a0;
                fVar72 = local_3a4;
                fVar74 = local_3a8;
                if ((int)local_2f8 == 0) {
                  uVar42 = local_2a0 & 0xffffffff;
                }
              }
            }
            uVar31 = uVar31 + 1;
          } while ((long)uVar31 < (long)psVar67[1].fontstart);
        }
        fVar69 = local_2b8[local_398].RasterizerMultiply;
        if ((fVar69 != 1.0) || (NAN(fVar69))) {
          lVar59 = 0;
          do {
            uVar27 = (uint)(long)((float)(int)lVar59 * fVar69);
            if (0xfe < uVar27) {
              uVar27 = 0xff;
            }
            *(char *)((long)&local_258[0].data + lVar59) = (char)uVar27;
            lVar59 = lVar59 + 1;
          } while (lVar59 != 0x100);
          if (0 < psVar67[1].cff.cursor) {
            lVar51._0_4_ = psVar67[1].hmtx;
            lVar51._4_4_ = psVar67[1].kern;
            iVar28 = 0;
            do {
              if ((*(int *)(lVar51 + 0x14) != 0) && (0 < *(int *)(lVar51 + 8))) {
                uVar27 = *(uint *)(lVar51 + 4);
                iVar63 = atlas->TexWidth;
                puVar35 = atlas->TexPixelsAlpha8 +
                          (long)*(int *)(lVar51 + 0x10) * (long)iVar63 +
                          (long)*(int *)(lVar51 + 0xc);
                iVar30 = *(int *)(lVar51 + 8);
                do {
                  if (0 < (int)uVar27) {
                    uVar31 = 0;
                    do {
                      puVar35[uVar31] =
                           *(uchar *)((long)&local_258[0].data + (ulong)puVar35[uVar31]);
                      uVar31 = uVar31 + 1;
                    } while (uVar27 != uVar31);
                  }
                  puVar35 = puVar35 + iVar63;
                  bVar17 = 1 < iVar30;
                  iVar30 = iVar30 + -1;
                } while (bVar17);
              }
              iVar28 = iVar28 + 1;
              lVar51 = lVar51 + 0x18;
            } while (iVar28 < psVar67[1].cff.cursor);
          }
        }
        psVar67[1].hmtx = 0;
        psVar67[1].kern = 0;
      }
      lVar59 = local_398 + 1;
    } while (lVar59 != lVar41);
  }
  ImGui::MemFree(local_3f0);
  ImGui::MemFree(local_310);
  uVar11 = local_458._8_8_;
  if ((void *)local_458._8_8_ != (void *)0x0) {
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_458._8_8_;
    local_458._0_16_ = auVar13 << 0x40;
    ImGui::MemFree((void *)uVar11);
    local_458._8_8_ = 0;
  }
  if (0 < (int)uVar5) {
    lVar64 = 0;
    do {
      lVar59 = lVar64 * 0x110;
      if (*(int *)((long)local_4c0 + lVar59 + 0xe8) != 0) {
        if ((atlas->ConfigData).Size <= lVar64) goto LAB_00189b3b;
        lVar51 = *(long *)((long)local_4c0 + lVar59 + 8);
        lVar49 = (long)*(int *)((long)local_4c0 + lVar59 + 0x24);
        uVar27 = (int)(short)((ushort)*(byte *)(lVar51 + 4 + lVar49) << 8) |
                 (uint)*(byte *)(lVar51 + 5 + lVar49);
        uVar71 = 0xbf800000;
        if (0 < (short)uVar27) {
          uVar71 = 0x3f800000;
        }
        local_468._0_4_ = uVar71;
        uVar55 = (int)(short)((ushort)*(byte *)(lVar51 + 6 + lVar49) << 8) |
                 (uint)*(byte *)(lVar51 + 7 + lVar49);
        fVar69 = -1.0;
        if (0 < (short)uVar55) {
          fVar69 = 1.0;
        }
        pIVar9 = (atlas->ConfigData).Data;
        pIVar61 = pIVar9 + lVar64;
        pIVar6 = pIVar9[lVar64].DstFont;
        if (pIVar9[lVar64].MergeMode == false) {
          fVar74 = pIVar9[lVar64].SizePixels;
          ImFont::ClearOutputData(pIVar6);
          fVar74 = fVar74 / (float)(int)(uVar27 - uVar55);
          pIVar6->FontSize = pIVar61->SizePixels;
          pIVar6->ConfigData = pIVar61;
          pIVar6->ConfigDataCount = 0;
          pIVar6->ContainerAtlas = atlas;
          pIVar6->Ascent = (float)(int)((float)(int)uVar27 * fVar74 + (float)local_468._0_4_);
          pIVar6->Descent = (float)(int)((float)(int)uVar55 * fVar74 + fVar69);
        }
        pIVar6->ConfigDataCount = pIVar6->ConfigDataCount + 1;
        if (0 < *(int *)((long)local_4c0 + lVar59 + 0xe8)) {
          fVar69 = (pIVar61->GlyphOffset).x;
          local_468 = ZEXT416((uint)((float)(int)(pIVar6->Ascent + 0.5) + (pIVar61->GlyphOffset).y))
          ;
          lVar49 = 0;
          lVar51 = 0;
          do {
            if (*(int *)((long)local_4c0 + lVar59 + 0x100) <= lVar51) goto LAB_00189a62;
            lVar52 = *(long *)((long)local_4c0 + lVar59 + 0xd0);
            fVar72 = 1.0 / (float)atlas->TexHeight;
            fVar74 = 1.0 / (float)atlas->TexWidth;
            ImFont::AddGlyph(pIVar6,pIVar61,
                             *(ImWchar *)(*(long *)((long)local_4c0 + lVar59 + 0x108) + lVar51 * 4),
                             *(float *)(lVar52 + 8 + lVar49) + 0.0 + fVar69,
                             *(float *)(lVar52 + 0xc + lVar49) + 0.0 + (float)local_468._0_4_,
                             *(float *)(lVar52 + 0x14 + lVar49) + 0.0 + fVar69,
                             *(float *)(lVar52 + 0x18 + lVar49) + 0.0 + (float)local_468._0_4_,
                             (float)*(ushort *)(lVar52 + lVar49) * fVar74,
                             (float)*(ushort *)(lVar52 + 2 + lVar49) * fVar72,
                             (float)*(ushort *)(lVar52 + 4 + lVar49) * fVar74,
                             (float)*(ushort *)(lVar52 + 6 + lVar49) * fVar72,
                             *(float *)(lVar52 + 0x10 + lVar49));
            lVar51 = lVar51 + 1;
            lVar49 = lVar49 + 0x1c;
          } while (lVar51 < *(int *)((long)local_4c0 + lVar59 + 0xe8));
        }
      }
      lVar64 = lVar64 + 1;
    } while (lVar64 != lVar41);
  }
  sVar16 = local_2c0;
  if (0 < (int)uVar5) {
    sVar54 = 0;
    do {
      pvVar34 = *(void **)((long)local_4c0 + sVar54 + 0x108);
      if (pvVar34 != (void *)0x0) {
        ImGui::MemFree(pvVar34);
      }
      pvVar34 = *(void **)((long)local_4c0 + sVar54 + 0xf8);
      if (pvVar34 != (void *)0x0) {
        ImGui::MemFree(pvVar34);
      }
      sVar54 = sVar54 + 0x110;
    } while (sVar16 != sVar54);
  }
  if (local_4c0 != (void *)0x0) {
    ImGui::MemFree(local_4c0);
    local_4c0 = (void *)0x0;
  }
  ImFontAtlasBuildFinish(atlas);
  if (pvStack_400 != (void *)0x0) {
    ImGui::MemFree(pvStack_400);
  }
  if ((void *)local_458._8_8_ != (void *)0x0) {
    ImGui::MemFree((void *)local_458._8_8_);
  }
LAB_00189950:
  bVar84 = (byte)((uint)iVar83 >> 0x18);
  if (local_418 != (void *)0x0) {
    ImGui::MemFree(local_418);
  }
  if (local_4c0 != (void *)0x0) {
    ImGui::MemFree(local_4c0);
  }
  return (bool)(bVar84 & 1);
LAB_00189b55:
  __function = "T &ImVector<ImFontBuildDstData>::operator[](int) [T = ImFontBuildDstData]";
  goto LAB_00189a77;
LAB_00189b3b:
  __function = "T &ImVector<ImFontConfig>::operator[](int) [T = ImFontConfig]";
  goto LAB_00189a77;
LAB_00189a62:
  __function = "T &ImVector<int>::operator[](int) [T = int]";
LAB_00189a77:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                ,0x74f,__function);
}

Assistant:

static bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        if (src_tmp.DstIndex == -1)
        {
            IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
            return false;
        }
        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        // When merging fonts with MergeMode=true:
        // - We can have multiple input fonts writing into a same destination font.
        // - dst_font->ConfigData is != from cfg which is our source configuration.
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont;

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            // Register glyph
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];
            stbtt_aligned_quad q;
            float unused_x = 0.0f, unused_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &unused_x, &unused_y, &q, 0);
            dst_font->AddGlyph(&cfg, (ImWchar)codepoint, q.x0 + font_off_x, q.y0 + font_off_y, q.x1 + font_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
        }
    }

    // Cleanup
    src_tmp_array.clear_destruct();

    ImFontAtlasBuildFinish(atlas);
    return true;
}